

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

DateCastResult
duckdb::Date::TryConvertDate
          (char *buf,idx_t len,idx_t *pos,date_t *result,bool *special,bool strict)

{
  idx_t iVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int32_t month;
  int32_t day;
  int32_t local_44;
  int32_t local_40;
  int32_t local_3c;
  ulong local_38;
  
  *special = false;
  *pos = 0;
  if (len != 0) {
    local_3c = 0;
    local_40 = -1;
    uVar8 = 0;
    do {
      bVar2 = buf[uVar8];
      if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
        bVar6 = bVar2;
        if (bVar2 == 0x2d) {
          uVar9 = uVar8 + 1;
          *pos = uVar9;
          if (len <= uVar9) {
            return ERROR_INCORRECT_FORMAT;
          }
          lVar3 = uVar8 + 1;
          uVar8 = uVar9;
          bVar6 = buf[lVar3];
        }
        if ((byte)(bVar6 - 0x30) < 10) {
          if (len <= uVar8) {
            return ERROR_INCORRECT_FORMAT;
          }
          uVar9 = 0;
          iVar10 = 0;
          while ((byte)(buf[uVar9 + uVar8] - 0x30U) < 10) {
            if (99999999 < iVar10) {
              return ERROR_RANGE;
            }
            iVar10 = (uint)(byte)buf[uVar9 + uVar8] + iVar10 * 10 + -0x30;
            iVar1 = uVar8 + 1 + uVar9;
            uVar9 = uVar9 + 1;
            *pos = iVar1;
            if (len - uVar8 == uVar9) {
              return ERROR_INCORRECT_FORMAT;
            }
          }
          if (uVar9 < 2 && strict) {
            return ERROR_INCORRECT_FORMAT;
          }
          local_44 = -iVar10;
          if (bVar2 != 0x2d) {
            local_44 = iVar10;
          }
          *pos = uVar8 + uVar9 + 1;
          local_38 = (ulong)(byte)buf[uVar8 + uVar9];
          uVar5 = (byte)buf[uVar8 + uVar9] - 0x20;
          if (0x3c < uVar5) {
            return ERROR_INCORRECT_FORMAT;
          }
          if ((0x100000000000a001U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
            return ERROR_INCORRECT_FORMAT;
          }
          bVar4 = ParseDoubleDigit(buf,len,pos,&local_40);
          if (bVar4) {
            uVar8 = *pos;
            if (len <= uVar8) {
              return ERROR_INCORRECT_FORMAT;
            }
            *pos = uVar8 + 1;
            if (len <= uVar8 + 1 || buf[uVar8] != (char)local_38) {
              return ERROR_INCORRECT_FORMAT;
            }
            bVar4 = ParseDoubleDigit(buf,len,pos,&local_3c);
            if (!bVar4) {
              return ERROR_INCORRECT_FORMAT;
            }
            uVar8 = *pos;
            if ((4 < len - uVar8) &&
               ((((byte)buf[uVar8] - 9 < 5 || (buf[uVar8] == 0x20)) && (buf[uVar8 + 1] == '(')))) {
              bVar6 = buf[uVar8 + 2];
              bVar7 = bVar6 | 0x20;
              if (0x19 < (byte)(bVar6 + 0xbf)) {
                bVar7 = bVar6;
              }
              if (bVar7 == 0x62) {
                bVar6 = buf[uVar8 + 3];
                bVar7 = bVar6 | 0x20;
                if (0x19 < (byte)(bVar6 + 0xbf)) {
                  bVar7 = bVar6;
                }
                if ((bVar7 == 99) && (buf[uVar8 + 4] == ')')) {
                  if (bVar2 == 0x2d) {
                    return ERROR_INCORRECT_FORMAT;
                  }
                  if (local_44 == 0) {
                    return ERROR_INCORRECT_FORMAT;
                  }
                  local_44 = 1 - iVar10;
                  uVar8 = uVar8 + 5;
                  *pos = uVar8;
                }
              }
            }
            if (strict) {
              if (uVar8 < len) {
                do {
                  uVar9 = uVar8 + 1;
                  if ((4 < (byte)buf[uVar8] - 9) && (buf[uVar8] != 0x20)) {
                    return ERROR_INCORRECT_FORMAT;
                  }
                  *pos = uVar9;
                  uVar8 = uVar9;
                } while (uVar9 != len);
              }
            }
            else if ((uVar8 < len) && ((byte)(buf[uVar8] - 0x30U) < 10)) {
              return ERROR_INCORRECT_FORMAT;
            }
            bVar4 = TryFromDate(local_44,local_40,local_3c,result);
            return !bVar4 * '\x02';
          }
          return ERROR_INCORRECT_FORMAT;
        }
        bVar4 = TryConvertDateSpecial(buf,len,pos,PINF);
        if (bVar4) {
          iVar10 = (uint)(bVar2 == 0x2d) * 2 + 0x7fffffff;
        }
        else {
          bVar4 = TryConvertDateSpecial(buf,len,pos,EPOCH);
          iVar10 = 0;
          if (!bVar4) {
            return ERROR_INCORRECT_FORMAT;
          }
        }
        result->days = iVar10;
        uVar8 = *pos;
        uVar9 = uVar8;
        if (uVar8 < len) goto LAB_00da6e9a;
        goto LAB_00da6ebe;
      }
      uVar8 = uVar8 + 1;
      *pos = uVar8;
    } while (len != uVar8);
  }
  return ERROR_INCORRECT_FORMAT;
  while( true ) {
    uVar8 = uVar8 + 1;
    *pos = uVar8;
    uVar9 = len;
    if (len == uVar8) break;
LAB_00da6e9a:
    if ((4 < (byte)buf[uVar8] - 9) && (uVar9 = uVar8, buf[uVar8] != 0x20)) break;
  }
LAB_00da6ebe:
  *special = true;
  return uVar9 != len;
}

Assistant:

DateCastResult Date::TryConvertDate(const char *buf, idx_t len, idx_t &pos, date_t &result, bool &special,
                                    bool strict) {
	special = false;
	pos = 0;
	if (len == 0) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	int32_t day = 0;
	int32_t month = -1;
	int32_t year = 0;
	bool yearneg = false;
	int sep;

	// skip leading spaces
	while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
		pos++;
	}

	if (pos >= len) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}
	if (buf[pos] == '-') {
		yearneg = true;
		pos++;
		if (pos >= len) {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
	}
	if (!StringUtil::CharacterIsDigit(buf[pos])) {
		// Check for special values
		if (TryConvertDateSpecial(buf, len, pos, PINF)) {
			result = yearneg ? date_t::ninfinity() : date_t::infinity();
		} else if (TryConvertDateSpecial(buf, len, pos, EPOCH)) {
			result = date_t::epoch();
		} else {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
		// skip trailing spaces - parsing must be strict here
		while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
			pos++;
		}
		special = true;
		return (pos == len) ? DateCastResult::SUCCESS : DateCastResult::ERROR_INCORRECT_FORMAT;
	}
	// first parse the year
	idx_t year_length = 0;
	for (; pos < len && StringUtil::CharacterIsDigit(buf[pos]); pos++) {
		if (year >= 100000000) {
			return DateCastResult::ERROR_RANGE;
		}
		year = (buf[pos] - '0') + year * 10;
		year_length++;
	}
	if (year_length < 2 && strict) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}
	if (yearneg) {
		year = -year;
	}

	if (pos >= len) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	// fetch the separator
	sep = buf[pos++];
	if (sep != ' ' && sep != '-' && sep != '/' && sep != '\\') {
		// invalid separator
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	// parse the month
	if (!Date::ParseDoubleDigit(buf, len, pos, month)) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	if (pos >= len) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	if (buf[pos++] != sep) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	if (pos >= len) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	// now parse the day
	if (!Date::ParseDoubleDigit(buf, len, pos, day)) {
		return DateCastResult::ERROR_INCORRECT_FORMAT;
	}

	// check for an optional trailing " (BC)""
	if (len - pos >= 5 && StringUtil::CharacterIsSpace(buf[pos]) && buf[pos + 1] == '(' &&
	    StringUtil::CharacterToLower(buf[pos + 2]) == 'b' && StringUtil::CharacterToLower(buf[pos + 3]) == 'c' &&
	    buf[pos + 4] == ')') {
		if (yearneg || year == 0) {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
		year = -year + 1;
		pos += 5;
	}

	// in strict mode, check remaining string for non-space characters
	if (strict) {
		// skip trailing spaces
		while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
			pos++;
		}
		// check position. if end was not reached, non-space chars remaining
		if (pos < len) {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
	} else {
		// in non-strict mode, check for any direct trailing digits
		if (pos < len && StringUtil::CharacterIsDigit(buf[pos])) {
			return DateCastResult::ERROR_INCORRECT_FORMAT;
		}
	}

	return Date::TryFromDate(year, month, day, result) ? DateCastResult::SUCCESS : DateCastResult::ERROR_RANGE;
}